

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_trng::portable_impl::uint128_&,_const_trng::portable_impl::uint128_&> * __thiscall
Catch::ExprLhs<trng::portable_impl::uint128_const&>::operator>
          (ExprLhs<const_trng::portable_impl::uint128_&> *this,uint128 *rhs)

{
  StringRef op;
  bool comparisonResult;
  uint128 *in_RDX;
  uint128 *in_RSI;
  BinaryExpr<const_trng::portable_impl::uint128_&,_const_trng::portable_impl::uint128_&> *in_RDI;
  uint128 *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff98;
  char *pcVar1;
  BinaryExpr<const_trng::portable_impl::uint128_&,_const_trng::portable_impl::uint128_&> *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult = trng::portable_impl::operator>(*(uint128 *)in_RSI->m_lo,*in_RDX);
  pcVar1 = (char *)in_RSI->m_lo;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffff98));
  op.m_size = (size_type)pBVar2;
  op.m_start = pcVar1;
  BinaryExpr<const_trng::portable_impl::uint128_&,_const_trng::portable_impl::uint128_&>::BinaryExpr
            (in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffff88);
  return pBVar2;
}

Assistant:

auto operator > ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs > rhs), m_lhs, ">", rhs };
        }